

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

int __thiscall
libcellml::Model::clone(Model *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  element_type *this_00;
  Entity *this_01;
  NamedEntity *this_02;
  ComponentEntity *pCVar1;
  Model *this_03;
  size_t sVar2;
  ulong uVar3;
  size_t index;
  ulong uVar4;
  size_t index_1;
  UnitsPtr UVar5;
  ComponentPtr CVar6;
  IndexStack indexStack;
  EquivalenceMap map;
  ComponentPtr c;
  Model local_98;
  ulong local_78;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  element_type *local_50;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_48;
  ComponentEntity local_40;
  
  create();
  this_01 = (Entity *)
            (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
            _vptr_Entity;
  Entity::id_abi_cxx11_((string *)local_70,(Entity *)__fn);
  Entity::setId(this_01,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  this_02 = (NamedEntity *)
            (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
            _vptr_Entity;
  NamedEntity::name_abi_cxx11_((string *)local_70,(NamedEntity *)__fn);
  NamedEntity::setName(this_02,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  pCVar1 = (ComponentEntity *)
           (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
  ComponentEntity::encapsulationId_abi_cxx11_((string *)local_70,(ComponentEntity *)__fn);
  ComponentEntity::setEncapsulationId(pCVar1,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  for (uVar4 = 0;
      uVar3 = *(long *)(*(long *)(__fn + 8) + 0x90) - *(long *)(*(long *)(__fn + 8) + 0x88) >> 4,
      uVar4 < uVar3; uVar4 = uVar4 + 1) {
    this_03 = (Model *)(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                       super_Entity._vptr_Entity;
    UVar5 = units(&local_98,(size_t)__fn);
    Units::clone((Units *)local_70,
                 (__fn *)local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                         super_Entity._vptr_Entity,
                 UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi,(int)uVar3,__arg);
    addUnits(this_03,(UnitsPtr *)local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                mPimpl);
  }
  uVar4 = 0;
  while( true ) {
    sVar2 = ComponentEntity::componentCount((ComponentEntity *)__fn);
    if (sVar2 <= uVar4) break;
    pCVar1 = (ComponentEntity *)
             (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             _vptr_Entity;
    CVar6 = ComponentEntity::component(&local_98.super_ComponentEntity,(size_t)__fn);
    Component::clone((Component *)local_70,
                     (__fn *)local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                             super_Entity._vptr_Entity,
                     CVar6.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._M_pi,(int)uVar3,__arg);
    ComponentEntity::addComponent(pCVar1,(ComponentPtr *)local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                mPimpl);
    uVar4 = uVar4 + 1;
  }
  this_00 = (element_type *)(local_70 + 8);
  uVar4 = 0;
  while( true ) {
    sVar2 = ComponentEntity::componentCount
                      ((ComponentEntity *)
                       (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                       super_Entity._vptr_Entity);
    if (sVar2 <= uVar4) break;
    ComponentEntity::component
              ((ComponentEntity *)local_70,
               (size_t)(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                       super_Entity._vptr_Entity);
    fixComponentUnits((ModelPtr *)this,(ComponentPtr *)local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
    uVar4 = uVar4 + 1;
  }
  local_70._8_4_ = _S_red;
  local_60._M_allocated_capacity = 0;
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)0x0;
  local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
       (EntityImpl *)0x0;
  local_98.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
  super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  uVar4 = 0;
  local_60._8_8_ = this_00;
  local_50 = this_00;
  while( true ) {
    local_78 = uVar4;
    sVar2 = ComponentEntity::componentCount((ComponentEntity *)__fn);
    if (sVar2 <= uVar4) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,&local_78);
    ComponentEntity::component(&local_40,(size_t)__fn);
    recordVariableEquivalences
              ((ComponentPtr *)&local_40,(EquivalenceMap *)local_70,(IndexStack *)&local_98);
    generateEquivalenceMap
              ((ComponentPtr *)&local_40,(EquivalenceMap *)local_70,(IndexStack *)&local_98);
    local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
         (EntityImpl *)
         ((long)&local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                 mPimpl[-1].mId.field_2 + 8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    uVar4 = local_78 + 1;
  }
  applyEquivalenceMapToModel((EquivalenceMap *)local_70,(ModelPtr *)this);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98);
  std::
  _Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
               *)local_70);
  return (int)this;
}

Assistant:

ModelPtr Model::clone() const
{
    auto m = create();

    m->setId(id());
    m->setName(name());

    m->setEncapsulationId(encapsulationId());

    for (size_t index = 0; index < pFunc()->mUnits.size(); ++index) {
        m->addUnits(units(index)->clone());
    }

    for (size_t index = 0; index < componentCount(); ++index) {
        m->addComponent(component(index)->clone());
    }

    for (size_t index = 0; index < m->componentCount(); ++index) {
        fixComponentUnits(m, m->component(index));
    }

    // Generate equivalence map starting from the models components.
    EquivalenceMap map;
    IndexStack indexStack;
    for (size_t index = 0; index < componentCount(); ++index) {
        indexStack.push_back(index);
        auto c = component(index);
        recordVariableEquivalences(c, map, indexStack);
        generateEquivalenceMap(c, map, indexStack);
        indexStack.pop_back();
    }
    applyEquivalenceMapToModel(map, m);

    return m;
}